

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldDataPdu.cpp
# Opt level: O2

void __thiscall DIS::MinefieldDataPdu::marshal(MinefieldDataPdu *this,DataStream *dataStream)

{
  pointer pTVar1;
  pointer pVVar2;
  long lVar3;
  ulong uVar4;
  TwoByteChunk x;
  
  MinefieldFamilyPdu::marshal(&this->super_MinefieldFamilyPdu,dataStream);
  EntityID::marshal(&this->_minefieldID,dataStream);
  EntityID::marshal(&this->_requestingEntityID,dataStream);
  DataStream::operator<<(dataStream,this->_minefieldSequenceNumbeer);
  DataStream::operator<<(dataStream,this->_requestID);
  DataStream::operator<<(dataStream,this->_pduSequenceNumber);
  DataStream::operator<<(dataStream,this->_numberOfPdus);
  DataStream::operator<<
            (dataStream,
             (uchar)(((long)(this->_mineLocation).
                            super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->_mineLocation).
                           super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18));
  DataStream::operator<<
            (dataStream,
             (uchar)((uint)(*(int *)&(this->_sensorTypes).
                                     super__Vector_base<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(this->_sensorTypes).
                                    super__Vector_base<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4));
  DataStream::operator<<(dataStream,this->_pad2);
  DataStream::operator<<(dataStream,this->_dataFilter);
  EntityType::marshal(&this->_mineType,dataStream);
  lVar3 = 8;
  for (uVar4 = 0;
      pTVar1 = (this->_sensorTypes).
               super__Vector_base<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->_sensorTypes).
                            super__Vector_base<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 4);
      uVar4 = uVar4 + 1) {
    x._vptr_TwoByteChunk = (_func_int **)&PTR__TwoByteChunk_001b2698;
    x._otherParameters = *(char (*) [2])(pTVar1->_otherParameters + lVar3 + -8);
    TwoByteChunk::marshal(&x,dataStream);
    TwoByteChunk::~TwoByteChunk(&x);
    lVar3 = lVar3 + 0x10;
  }
  DataStream::operator<<(dataStream,this->_pad3);
  lVar3 = 8;
  uVar4 = 0;
  while( true ) {
    pVVar2 = (this->_mineLocation).
             super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_mineLocation).
                       super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pVVar2) / 0x18) <= uVar4)
    break;
    x._vptr_TwoByteChunk = (_func_int **)&PTR__Vector3Float_001b27c0;
    x._8_8_ = *(undefined8 *)((long)&pVVar2->_vptr_Vector3Float + lVar3);
    Vector3Float::marshal((Vector3Float *)&x,dataStream);
    Vector3Float::~Vector3Float((Vector3Float *)&x);
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x18;
  }
  return;
}

Assistant:

void MinefieldDataPdu::marshal(DataStream& dataStream) const
{
    MinefieldFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _minefieldID.marshal(dataStream);
    _requestingEntityID.marshal(dataStream);
    dataStream << _minefieldSequenceNumbeer;
    dataStream << _requestID;
    dataStream << _pduSequenceNumber;
    dataStream << _numberOfPdus;
    dataStream << ( unsigned char )_mineLocation.size();
    dataStream << ( unsigned char )_sensorTypes.size();
    dataStream << _pad2;
    dataStream << _dataFilter;
    _mineType.marshal(dataStream);

     for(size_t idx = 0; idx < _sensorTypes.size(); idx++)
     {
        TwoByteChunk x = _sensorTypes[idx];
        x.marshal(dataStream);
     }

    dataStream << _pad3;

     for(size_t idx = 0; idx < _mineLocation.size(); idx++)
     {
        Vector3Float x = _mineLocation[idx];
        x.marshal(dataStream);
     }

}